

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O0

void text_reporter_print_results
               (char *buf,char *prepend,int passes,int failures,int skips,int exceptions,
               uint32_t duration,_Bool use_colors)

{
  char *pcVar1;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  char *in_stack_ffffffffffffffb0;
  
  sprintf(in_RDI,"%s",in_RSI);
  if ((((in_EDX == 0) && (in_ECX == 0)) && (in_R8D == 0)) && (in_R9D == 0)) {
    strcat(in_RDI,"No assertions");
  }
  else {
    if (in_EDX != 0) {
      pcVar1 = format_passes(0,false);
      strcat(in_RDI,pcVar1);
    }
    if (in_R8D != 0) {
      insert_comma(in_stack_ffffffffffffffb0);
      pcVar1 = format_skips(0,false);
      strcat(in_RDI,pcVar1);
    }
    if (in_ECX != 0) {
      insert_comma(in_stack_ffffffffffffffb0);
      pcVar1 = format_failures(0,false);
      strcat(in_RDI,pcVar1);
    }
    if (in_R9D != 0) {
      insert_comma(in_stack_ffffffffffffffb0);
      pcVar1 = format_exceptions(0,false);
      strcat(in_RDI,pcVar1);
    }
    pcVar1 = format_duration(0);
    strcat(in_RDI,pcVar1);
  }
  return;
}

Assistant:

static void text_reporter_print_results(char *buf, char *prepend,
    int passes, int failures, int skips, int exceptions, uint32_t duration,
    bool use_colors) {

    sprintf(buf, "%s", prepend);
    if (passes || failures || skips || exceptions) {
        if (passes)
            strcat(buf, format_passes(passes, use_colors));
        if (skips) {
            insert_comma(buf);
            strcat(buf, format_skips(skips, use_colors));
        }
        if (failures) {
            insert_comma(buf);
            strcat(buf, format_failures(failures, use_colors));
        }
        if (exceptions) {
            insert_comma(buf);
            strcat(buf, format_exceptions(exceptions, use_colors));
        }
        strcat(buf, format_duration(duration));
    } else {
        strcat(buf, "No assertions");
    }
}